

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O2

QAsn1Element * __thiscall QAsn1Element::toDateTime(QAsn1Element *this)

{
  ulong uVar1;
  char *pcVar2;
  Data *pDVar3;
  Data DVar4;
  char cVar5;
  long lVar6;
  char *in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QStringView QVar7;
  QLatin1StringView latin1_00;
  QStringView QVar8;
  QStringView QVar9;
  Data local_58;
  undefined4 local_4c;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)this = 0xaaaaaaaaaaaaaaaa;
  QDateTime::QDateTime((QDateTime *)this);
  uVar1 = *(ulong *)(in_RSI + 0x18);
  if ((((uVar1 | 2) == 0xf) && (pcVar2 = *(char **)(in_RSI + 0x10), (int)*pcVar2 - 0x30U < 10)) &&
     (pcVar2[uVar1 - 1] == 'Z')) {
    if (*in_RSI == '\x18') {
      if (uVar1 == 0xf) {
        QString::fromLatin1<void>((QString *)&local_48,(QByteArray *)(in_RSI + 8));
        QVar9.m_data = (storage_type_conflict *)0xf;
        QVar9.m_size = (qsizetype)&local_48;
        QDateTime::fromString((QString *)&local_58,QVar9,0x138206);
        DVar4.s = *(ShortData *)this;
        *(Data *)this = local_58;
        local_58.s = DVar4.s;
        QDateTime::~QDateTime((QDateTime *)&local_58.s);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      }
    }
    else if ((*in_RSI == '\x17') && (uVar1 == 0xd)) {
      latin1.m_data = pcVar2;
      latin1.m_size = 6;
      QString::QString((QString *)&local_48,latin1);
      QVar7.m_data = L"yyMMdd";
      QVar7.m_size = 6;
      lVar6 = QDate::fromString((QString *)&local_48,QVar7,0x79e);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      if (lVar6 + 0xb69eeff91fU < 0x16d3e147974) {
        latin1_00.m_data = pcVar2 + 6;
        latin1_00.m_size = 6;
        QString::QString((QString *)&local_48,latin1_00);
        QVar8.m_data = L"HHmmss";
        QVar8.m_size = 6;
        local_4c = QTime::fromString((QString *)&local_48,QVar8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        cVar5 = QTime::isValid();
        if (cVar5 != '\0') {
          local_58 = (Data)0x2;
          QDateTime::QDateTime((QDateTime *)&local_48,lVar6,local_4c,&local_58,1);
          pDVar3 = *(Data **)this;
          *(Data **)this = local_48.d;
          local_48.d = pDVar3;
          QDateTime::~QDateTime((QDateTime *)&local_48);
          QTimeZone::~QTimeZone((QTimeZone *)&local_58.s);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QAsn1Element::toDateTime() const
{
    QDateTime result;

    if (mValue.size() != 13 && mValue.size() != 15)
        return result;

    // QDateTime::fromString is lenient and accepts +- signs in front
    // of the year; but ASN.1 doesn't allow them.
    if (!isAsciiDigit(mValue[0]))
        return result;

    // Timezone must be present, and UTC
    if (mValue.back() != 'Z')
        return result;

    if (mType == UtcTimeType && mValue.size() == 13) {
        // RFC 2459:
        //   Where YY is greater than or equal to 50, the year shall be
        //   interpreted as 19YY; and
        //
        //   Where YY is less than 50, the year shall be interpreted as 20YY.
        //
        // so use 1950 as base year.
        constexpr int rfc2459CenturyStart = 1950;
        const QLatin1StringView inputView(mValue);
        QDate date = QDate::fromString(inputView.first(6), u"yyMMdd", rfc2459CenturyStart);
        if (!date.isValid())
            return result;

        Q_ASSERT(date.year() >= rfc2459CenturyStart);
        Q_ASSERT(date.year() < 100 + rfc2459CenturyStart);

        QTime time = QTime::fromString(inputView.sliced(6, 6), u"HHmmss");
        if (!time.isValid())
            return result;
        result = QDateTime(date, time, QTimeZone::UTC);
    } else if (mType == GeneralizedTimeType && mValue.size() == 15) {
        result = QDateTime::fromString(QString::fromLatin1(mValue), u"yyyyMMddHHmmsst");
    }

    return result;
}